

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
get_param::operator()
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          get_param *this,int arg_position,string_view longp,string_view shortp)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  string_view str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view arg;
  
  uVar3 = longp._M_len;
  __s = this->argv[arg_position];
  sVar2 = strlen(__s);
  this->i = arg_position;
  str._M_str = __s;
  str._M_len = sVar2;
  arg._M_len = sVar2;
  arg._M_str = __s;
  bVar1 = starts_with(str,longp);
  if ((uVar3 < sVar2 && bVar1) && ((__s[uVar3] == '=' || (__s[uVar3] == ':')))) {
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&arg,uVar3 + 1,0xffffffffffffffff);
  }
  else {
    str_00._M_str = __s;
    str_00._M_len = sVar2;
    bVar1 = starts_with(str_00,shortp);
    if (sVar2 <= shortp._M_len || !bVar1) {
      iVar4 = arg_position + 1;
      if ((iVar4 < this->argc) &&
         ((bVar5._M_str = __s, bVar5._M_len = sVar2, bVar1 = std::operator==(bVar5,longp), bVar1 ||
          (__x._M_str = __s, __x._M_len = sVar2, bVar1 = std::operator==(__x,shortp), bVar1)))) {
        this->i = iVar4;
        std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
        optional<const_char_*&,_true>(__return_storage_ptr__,this->argv + iVar4);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = false;
      return __return_storage_ptr__;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&arg,shortp._M_len,0xffffffffffffffff);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value = bVar5;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

constexpr std::optional<std::string_view> operator()(
      int arg_position,
      const std::string_view longp,
      const std::string_view shortp) noexcept
    {
        std::string_view arg(argv[arg_position]);
        i = arg_position;

        if (starts_with(arg, longp) && arg.size() > longp.size() &&
            (arg[longp.size()] == '=' || arg[longp.size()] == ':'))
            return arg.substr(longp.size() + 1);

        if (starts_with(arg, shortp) && arg.size() > shortp.size())
            return arg.substr(shortp.size());

        if (arg_position + 1 < argc) {
            if (arg == longp) {
                i = arg_position + 1;
                return argv[i];
            }

            if (arg == shortp) {
                i = arg_position + 1;
                return argv[i];
            }
        }

        return std::nullopt;
    }